

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_crc32.cc
# Opt level: O0

int __thiscall CCRC32::Get_CRC(CCRC32 *this,uchar *buffer,uint dwSize)

{
  int len;
  uint crc;
  uint dwSize_local;
  uchar *buffer_local;
  CCRC32 *this_local;
  
  crc = 0xffffffff;
  len = dwSize;
  buffer_local = buffer;
  while (len != 0) {
    crc = crc >> 8 ^ this->crc32_table[crc & 0xff ^ (uint)*buffer_local];
    len = len + -1;
    buffer_local = buffer_local + 1;
  }
  return crc ^ 0xffffffff;
}

Assistant:

int CCRC32::Get_CRC(unsigned char* buffer, unsigned int dwSize)
{
	// Be sure to use unsigned variables,
	// because negative values introduce high bits
	// where zero bits are required.
	//unsigned long  crc(0xffffffff);
    unsigned int  crc(0xffffffff);
	int len;
	
	len = dwSize;	
	// Perform the algorithm on each character
	// in the string, using the lookup table values.
	while(len--)
		crc = (crc >> 8) ^ crc32_table[(crc & 0xFF) ^ *buffer++];
	// Exclusive OR the result with the beginning value.
	return crc^0xffffffff;
}